

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O0

void __thiscall
TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *cp)

{
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *unaff_retaddr;
  TPZStack<TPZEqnArray<double>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>>
            (in_RDI,0x21);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZFrontMatrix
            (unaff_retaddr,(void **)vtt,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_025530c8;
  TPZStack<TPZEqnArray<double>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 130000) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbd8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf8) = 0;
  std::mutex::mutex((mutex *)0x1d3cb13);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x1fc00));
  TPZManVector<TPZEqnArray<double>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<double>_*,_10> *)in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}